

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::tryExpandUsage
          (DataLocationUsage *this,Group *group,DataLocation *location,uint desiredUsage,
          bool newHoles)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar39 [16];
  Fault f;
  Fault local_20;
  
  if ((desiredUsage <= location->lgSize) ||
     (bVar9 = Union::DataLocation::tryExpandTo(location,group->parent,desiredUsage), bVar9)) {
    auVar8 = _DAT_0057c280;
    auVar7 = _DAT_0057c270;
    auVar6 = _DAT_0057c260;
    auVar5 = _DAT_00501130;
    auVar4 = _DAT_00501120;
    if (newHoles) {
      uVar11 = (ulong)this->lgSizeUsed;
      if (this->lgSizeUsed < (byte)desiredUsage) {
        uVar12 = (ulong)(desiredUsage & 7);
        if ((ulong)(desiredUsage & 7) < uVar11 + 1) {
          uVar12 = uVar11 + 1;
        }
        lVar13 = (uVar12 - uVar11) + -1;
        auVar15._8_4_ = (int)lVar13;
        auVar15._0_8_ = lVar13;
        auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar14 = 0;
        auVar15 = auVar15 ^ _DAT_00501130;
        do {
          auVar27._8_4_ = (int)uVar14;
          auVar27._0_8_ = uVar14;
          auVar27._12_4_ = (int)(uVar14 >> 0x20);
          auVar19 = (auVar27 | auVar4) ^ auVar5;
          iVar28 = auVar15._0_4_;
          iVar34 = -(uint)(iVar28 < auVar19._0_4_);
          iVar16 = auVar15._4_4_;
          auVar20._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
          iVar33 = auVar15._8_4_;
          iVar36 = -(uint)(iVar33 < auVar19._8_4_);
          iVar17 = auVar15._12_4_;
          auVar20._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
          auVar30._4_4_ = iVar34;
          auVar30._0_4_ = iVar34;
          auVar30._8_4_ = iVar36;
          auVar30._12_4_ = iVar36;
          auVar37 = pshuflw(in_XMM11,auVar30,0xe8);
          auVar22._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
          auVar22._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
          auVar22._0_4_ = auVar22._4_4_;
          auVar22._8_4_ = auVar22._12_4_;
          auVar39 = pshuflw(in_XMM12,auVar22,0xe8);
          auVar20._0_4_ = auVar20._4_4_;
          auVar20._8_4_ = auVar20._12_4_;
          auVar38 = pshuflw(auVar37,auVar20,0xe8);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar19 = (auVar38 | auVar39 & auVar37) ^ auVar19;
          auVar19 = packssdw(auVar19,auVar19);
          if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar11] = '\x01';
          }
          auVar20 = auVar22 & auVar30 | auVar20;
          auVar19 = packssdw(auVar20,auVar20);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar38,auVar19 ^ auVar38);
          if ((auVar19._0_4_ >> 0x10 & 1) != 0) {
            (this->holes).holes[uVar14 + uVar11 + 1] = '\x01';
          }
          auVar19 = (auVar27 | auVar8) ^ auVar5;
          iVar34 = -(uint)(iVar28 < auVar19._0_4_);
          auVar35._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
          iVar36 = -(uint)(iVar33 < auVar19._8_4_);
          auVar35._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
          auVar21._4_4_ = iVar34;
          auVar21._0_4_ = iVar34;
          auVar21._8_4_ = iVar36;
          auVar21._12_4_ = iVar36;
          auVar29._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
          auVar29._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
          auVar29._0_4_ = auVar29._4_4_;
          auVar29._8_4_ = auVar29._12_4_;
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar19 = auVar29 & auVar21 | auVar35;
          auVar19 = packssdw(auVar19,auVar19);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar1,auVar19 ^ auVar1);
          if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar11 + 2] = '\x01';
          }
          auVar22 = pshufhw(auVar21,auVar21,0x84);
          auVar30 = pshufhw(auVar29,auVar29,0x84);
          auVar20 = pshufhw(auVar22,auVar35,0x84);
          auVar23._8_4_ = 0xffffffff;
          auVar23._0_8_ = 0xffffffffffffffff;
          auVar23._12_4_ = 0xffffffff;
          auVar23 = (auVar20 | auVar30 & auVar22) ^ auVar23;
          auVar22 = packssdw(auVar23,auVar23);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar11 + 3] = '\x01';
          }
          auVar22 = (auVar27 | auVar7) ^ auVar5;
          iVar34 = -(uint)(iVar28 < auVar22._0_4_);
          auVar25._4_4_ = -(uint)(iVar16 < auVar22._4_4_);
          iVar36 = -(uint)(iVar33 < auVar22._8_4_);
          auVar25._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
          auVar31._4_4_ = iVar34;
          auVar31._0_4_ = iVar34;
          auVar31._8_4_ = iVar36;
          auVar31._12_4_ = iVar36;
          auVar19 = pshuflw(auVar19,auVar31,0xe8);
          auVar24._4_4_ = -(uint)(auVar22._4_4_ == iVar16);
          auVar24._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar22 = pshuflw(auVar39 & auVar37,auVar24,0xe8);
          in_XMM12 = auVar22 & auVar19;
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar19 = pshuflw(auVar19,auVar25,0xe8);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar37 = (auVar19 | in_XMM12) ^ auVar37;
          in_XMM11 = packssdw(auVar37,auVar37);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar11 + 4] = '\x01';
          }
          auVar25 = auVar24 & auVar31 | auVar25;
          auVar19 = packssdw(auVar25,auVar25);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar39,auVar19 ^ auVar39);
          if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar11 + 5] = '\x01';
          }
          auVar19 = (auVar27 | auVar6) ^ auVar5;
          iVar28 = -(uint)(iVar28 < auVar19._0_4_);
          auVar32._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
          iVar33 = -(uint)(iVar33 < auVar19._8_4_);
          auVar32._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
          auVar26._4_4_ = iVar28;
          auVar26._0_4_ = iVar28;
          auVar26._8_4_ = iVar33;
          auVar26._12_4_ = iVar33;
          auVar18._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
          auVar18._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
          auVar18._0_4_ = auVar18._4_4_;
          auVar18._8_4_ = auVar18._12_4_;
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar19 = auVar18 & auVar26 | auVar32;
          auVar19 = packssdw(auVar19,auVar19);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar2,auVar19 ^ auVar2);
          if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar14 + uVar11 + -2] = '\x01';
          }
          auVar27 = pshufhw(auVar26,auVar26,0x84);
          auVar19 = pshufhw(auVar18,auVar18,0x84);
          auVar22 = pshufhw(auVar27,auVar32,0x84);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 & auVar27,(auVar22 | auVar19 & auVar27) ^ auVar3);
          if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar14 + uVar11 + -1] = '\x01';
          }
          uVar14 = uVar14 + 8;
        } while (((uVar12 - uVar11) + 7 & 0xfffffffffffffff8) != uVar14);
      }
    }
    else {
      pcVar10 = getenv("CAPNP_IGNORE_ISSUE_344");
      if (pcVar10 == (char *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[177]>
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x1b4,FAILED,(char *)0x0,
                   "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344\""
                   ,(char (*) [177])
                    "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344"
                  );
        kj::_::Debug::Fault::fatal(&local_20);
      }
    }
    this->lgSizeUsed = (byte)desiredUsage;
    bVar9 = true;
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool tryExpandUsage(Group& group, Union::DataLocation& location, uint desiredUsage,
                          bool newHoles) {
        if (desiredUsage > location.lgSize) {
          // Need to expand the underlying slot.
          if (!location.tryExpandTo(group.parent, desiredUsage)) {
            return false;
          }
        }

        // Underlying slot is big enough, so expand our size and update holes.
        if (newHoles) {
          holes.addHolesAtEnd(lgSizeUsed, 1, desiredUsage);
        } else if (shouldDetectIssue344()) {
          // Unfortunately, Cap'n Proto 0.5.x and below would always call addHolesAtEnd(), which
          // was the wrong thing to do when called from tryExpand(), which itself is only called
          // in cases involving unions nested in other unions. The bug could lead to multiple
          // fields in a group incorrectly being assigned overlapping offsets. Although the bug
          // is now fixed by adding the `newHoles` parameter, this silently breaks
          // backwards-compatibility with affected schemas. Therefore, for now, we throw an
          // exception to alert developers of the problem.
          //
          // TODO(cleanup): Once sufficient time has elapsed, remove this assert.
          KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344");
        }
        lgSizeUsed = desiredUsage;
        return true;
      }